

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

void av1_tile_set_row(TileInfo *tile,AV1_COMMON *cm,int row)

{
  int iVar1;
  int iVar2;
  int local_20;
  int mi_row_end;
  int mi_row_start;
  int row_local;
  AV1_COMMON *cm_local;
  TileInfo *tile_local;
  
  iVar1 = (cm->tiles).row_start_sb[row];
  iVar2 = cm->seq_params->mib_size_log2;
  local_20 = (cm->tiles).row_start_sb[row + 1] << ((byte)cm->seq_params->mib_size_log2 & 0x1f);
  tile->tile_row = row;
  tile->mi_row_start = iVar1 << ((byte)iVar2 & 0x1f);
  if ((cm->mi_params).mi_rows <= local_20) {
    local_20 = (cm->mi_params).mi_rows;
  }
  tile->mi_row_end = local_20;
  return;
}

Assistant:

void av1_tile_set_row(TileInfo *tile, const AV1_COMMON *cm, int row) {
  assert(row < cm->tiles.rows);
  int mi_row_start = cm->tiles.row_start_sb[row]
                     << cm->seq_params->mib_size_log2;
  int mi_row_end = cm->tiles.row_start_sb[row + 1]
                   << cm->seq_params->mib_size_log2;
  tile->tile_row = row;
  tile->mi_row_start = mi_row_start;
  tile->mi_row_end = AOMMIN(mi_row_end, cm->mi_params.mi_rows);
  assert(tile->mi_row_end > tile->mi_row_start);
}